

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

SpecifyBlockSyntax * __thiscall
slang::parsing::Parser::parseSpecifyBlock(Parser *this,AttrList attributes)

{
  SyntaxNode *pSVar1;
  bool bVar2;
  int iVar3;
  Diagnostic *this_00;
  SourceLocation SVar4;
  undefined4 extraout_var;
  SpecifyBlockSyntax *pSVar5;
  BumpAllocator *dst;
  bool bVar6;
  byte bVar7;
  bool bVar8;
  Token TVar9;
  SourceRange range;
  string_view arg;
  Token specify;
  MemberSyntax *member;
  pointer local_100;
  size_t local_f8;
  Info *local_f0;
  undefined8 local_e8;
  Token *local_e0;
  Token *local_d8;
  Token endspecify;
  SyntaxList<slang::syntax::MemberSyntax> local_c0;
  SmallVector<slang::syntax::MemberSyntax_*,_8UL> members;
  
  local_f8 = (size_t)attributes._M_extent._M_extent_value;
  local_100 = attributes._M_ptr;
  TVar9 = ParserBase::consume(&this->super_ParserBase);
  local_f0 = TVar9.info;
  local_e8 = TVar9._0_8_;
  Token::Token(&endspecify);
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
       (pointer)members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len = 0;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 8;
  local_d8 = &(this->super_ParserBase).lastPoppedDelims.first;
  local_e0 = &(this->super_ParserBase).lastPoppedDelims.second;
  bVar6 = false;
  while( true ) {
    TVar9 = ParserBase::peek(&this->super_ParserBase);
    if ((TVar9.kind == EndOfFile) || ((TVar9._0_4_ & 0xffff) == 0x9d)) break;
    member = parseSpecifyItem(this);
    bVar8 = member == (MemberSyntax *)0x0;
    if (bVar8) {
      bVar2 = slang::syntax::SyntaxFacts::isCloseDelimOrKeyword(TVar9.kind);
      if (bVar2) {
        local_c0.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
        range = Token::range((Token *)&local_c0);
        this_00 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xb80005,range);
        local_c0.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
        arg = Token::valueText((Token *)&local_c0);
        Diagnostic::operator<<(this_00,arg);
        bVar7 = 0;
        if (((this->super_ParserBase).lastPoppedDelims.first.info != (Info *)0x0) &&
           (bVar7 = 0, (this->super_ParserBase).lastPoppedDelims.second.info != (Info *)0x0)) {
          SVar4 = Token::location(local_d8);
          Diagnostic::addNote(this_00,(DiagCode)0xc10005,SVar4);
          SVar4 = Token::location(local_e0);
          Diagnostic::addNote(this_00,(DiagCode)0xc00005,SVar4);
          bVar7 = 0;
        }
      }
      else {
        bVar7 = ~bVar6 & 1;
      }
      ParserBase::skipToken
                (&this->super_ParserBase,
                 (optional<slang::DiagCode>)((uint6)bVar7 << 0x20 | 0x450005));
      bVar6 = bVar8;
    }
    else {
      SmallVectorBase<slang::syntax::MemberSyntax*>::
      emplace_back<slang::syntax::MemberSyntax*const&>
                ((SmallVectorBase<slang::syntax::MemberSyntax*> *)&members,&member);
      pSVar1 = this->previewNode;
      this->previewNode = (SyntaxNode *)0x0;
      (member->super_SyntaxNode).previewNode = pSVar1;
      bVar6 = bVar8;
    }
  }
  endspecify = ParserBase::expect(&this->super_ParserBase,EndSpecifyKeyword);
  dst = (this->super_ParserBase).alloc;
  iVar3 = SmallVectorBase<slang::syntax::MemberSyntax_*>::copy
                    (&members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>,
                     (EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)endspecify.info);
  SmallVectorBase<slang::syntax::MemberSyntax_*>::cleanup
            (&members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>,(EVP_PKEY_CTX *)dst);
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len =
       CONCAT44(members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len._4_4_,1);
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 0;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[0] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[1] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[2] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[3] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[4] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[5] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[6] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[7] = '\0';
  members.stackBase[0] = (undefined1)local_f8;
  members.stackBase[1] = local_f8._1_1_;
  members.stackBase[2] = local_f8._2_1_;
  members.stackBase[3] = local_f8._3_1_;
  members.stackBase[4] = local_f8._4_1_;
  members.stackBase[5] = local_f8._5_1_;
  members.stackBase[6] = local_f8._6_1_;
  members.stackBase[7] = local_f8._7_1_;
  members.stackBase._8_8_ = local_100;
  members.stackBase[0x10] = (undefined1)local_f8;
  members.stackBase[0x11] = local_f8._1_1_;
  members.stackBase[0x12] = local_f8._2_1_;
  members.stackBase[0x13] = local_f8._3_1_;
  members.stackBase[0x14] = local_f8._4_1_;
  members.stackBase[0x15] = local_f8._5_1_;
  members.stackBase[0x16] = local_f8._6_1_;
  members.stackBase[0x17] = local_f8._7_1_;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
       (pointer)&PTR_getChild_00b667e8;
  local_c0.super_SyntaxListBase.super_SyntaxNode.kind = 1;
  local_c0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_c0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_c0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00b6ea38;
  specify.info = local_f0;
  specify.kind = (undefined2)local_e8;
  specify._2_1_ = local_e8._2_1_;
  specify.numFlags.raw = local_e8._3_1_;
  specify.rawLen = local_e8._4_4_;
  local_c0.super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr =
       (pointer)CONCAT44(extraout_var,iVar3);
  pSVar5 = slang::syntax::SyntaxFactory::specifyBlock
                     (&this->factory,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&members,
                      specify,&local_c0,endspecify);
  return pSVar5;
}

Assistant:

SpecifyBlockSyntax& Parser::parseSpecifyBlock(AttrList attributes) {
    auto specify = consume();

    Token endspecify;
    auto members = parseMemberList<MemberSyntax>(
        TokenKind::EndSpecifyKeyword, endspecify, SyntaxKind::SpecifyBlock,
        [this](SyntaxKind, bool&) { return parseSpecifyItem(); });

    return factory.specifyBlock(attributes, specify, members, endspecify);
}